

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void av1_dr_prediction_z1_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  int in_EDX;
  int in_stack_00000054;
  uint8_t *in_stack_00000058;
  ptrdiff_t in_stack_00000060;
  uint8_t *in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000098;
  int in_stack_0000009c;
  uint8_t *in_stack_000000a0;
  ptrdiff_t in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  int in_stack_000000bc;
  int in_stack_00000150;
  int in_stack_00000154;
  uint8_t *in_stack_00000158;
  ptrdiff_t in_stack_00000160;
  uint8_t *in_stack_00000168;
  int in_stack_00000170;
  int in_stack_00000350;
  int in_stack_00000354;
  uint8_t *in_stack_00000358;
  ptrdiff_t in_stack_00000360;
  uint8_t *in_stack_00000368;
  int in_stack_00000370;
  int in_stack_00000758;
  int in_stack_0000075c;
  uint8_t *in_stack_00000760;
  ptrdiff_t in_stack_00000768;
  uint8_t *in_stack_00000770;
  int in_stack_0000077c;
  
  if (in_EDX == 4) {
    dr_prediction_z1_4xN_sse4_1
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
               in_stack_00000054,dy);
  }
  else if (in_EDX == 8) {
    dr_prediction_z1_8xN_sse4_1
              (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
               in_stack_00000154,in_stack_00000150);
  }
  else if (in_EDX == 0x10) {
    dr_prediction_z1_16xN_sse4_1
              (in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358,
               in_stack_00000354,in_stack_00000350);
  }
  else if (in_EDX == 0x20) {
    dr_prediction_z1_32xN_sse4_1
              (in_stack_0000077c,in_stack_00000770,in_stack_00000768,in_stack_00000760,
               in_stack_0000075c,in_stack_00000758);
  }
  else if (in_EDX == 0x40) {
    dr_prediction_z1_64xN_sse4_1
              (in_stack_000000bc,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
               in_stack_0000009c,in_stack_00000098);
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    default: assert(0 && "Invalid block size");
  }
  return;
}